

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O2

void OpenMD::registerLattice(void)

{
  LatticeFactory *pLVar1;
  LatticeCreator *pLVar2;
  allocator<char> local_39;
  string local_38;
  
  pLVar1 = LatticeFactory::getInstance();
  pLVar2 = (LatticeCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"FCC",&local_39);
  LatticeBuilder<OpenMD::FCCLattice>::LatticeBuilder
            ((LatticeBuilder<OpenMD::FCCLattice> *)pLVar2,&local_38);
  LatticeFactory::registerLattice(pLVar1,pLVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pLVar1 = LatticeFactory::getInstance();
  pLVar2 = (LatticeCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SC",&local_39);
  LatticeBuilder<OpenMD::SCLattice>::LatticeBuilder
            ((LatticeBuilder<OpenMD::SCLattice> *)pLVar2,&local_38);
  LatticeFactory::registerLattice(pLVar1,pLVar2);
  std::__cxx11::string::~string((string *)&local_38);
  pLVar1 = LatticeFactory::getInstance();
  pLVar2 = (LatticeCreator *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"BCC",&local_39);
  LatticeBuilder<OpenMD::BCCLattice>::LatticeBuilder
            ((LatticeBuilder<OpenMD::BCCLattice> *)pLVar2,&local_38);
  LatticeFactory::registerLattice(pLVar1,pLVar2);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void registerLattice() {
    LatticeFactory::getInstance().registerLattice(
        new LatticeBuilder<FCCLattice>("FCC"));
    LatticeFactory::getInstance().registerLattice(
        new LatticeBuilder<SCLattice>("SC"));
    LatticeFactory::getInstance().registerLattice(
        new LatticeBuilder<BCCLattice>("BCC"));
  }